

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::markAsDisconnected(CoreBroker *this,GlobalBrokerId brkid)

{
  GlobalBrokerId brkid_00;
  pointer pBVar1;
  pointer pBVar2;
  size_t ii;
  ulong uVar3;
  size_t ii_1;
  long lVar4;
  
  lVar4 = 0x2c;
  for (uVar3 = 0;
      pBVar1 = (this->mBrokers).dataStorage.
               super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->mBrokers).dataStorage.
                             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x58);
      uVar3 = uVar3 + 1) {
    brkid_00.gid = *(BaseType *)((long)pBVar1 + lVar4 + -0xc);
    if ((brkid_00.gid == brkid.gid) && (*(char *)((long)&(pBVar1->name)._M_dataplus + lVar4) != '(')
       ) {
      *(undefined1 *)((long)&(pBVar1->name)._M_dataplus + lVar4) = 0x32;
    }
    if ((*(int *)((long)pBVar1 + lVar4 + -4) == brkid.gid) &&
       (*(char *)((long)&(pBVar1->name)._M_dataplus + lVar4) != '(')) {
      *(undefined1 *)((long)&(pBVar1->name)._M_dataplus + lVar4) = 0x32;
      markAsDisconnected(this,brkid_00);
    }
    lVar4 = lVar4 + 0x58;
  }
  lVar4 = 0x30;
  for (uVar3 = 0;
      pBVar2 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->mFederates).dataStorage.
                             super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x38);
      uVar3 = uVar3 + 1) {
    if (((*(int *)((long)pBVar2 + lVar4 + -8) == brkid.gid) &&
        (*(char *)((long)pBVar2 + lVar4 + -4) != '(')) &&
       (*(undefined1 *)((long)pBVar2 + lVar4 + -4) = 0x32,
       *(char *)((long)&(pBVar2->name)._M_dataplus + lVar4) == '\x01')) {
      HandleManager::removeFederateHandles
                (&this->handles,(GlobalFederateId)*(BaseType *)((long)pBVar2 + lVar4 + -0x10));
    }
    lVar4 = lVar4 + 0x38;
  }
  return;
}

Assistant:

void CoreBroker::markAsDisconnected(GlobalBrokerId brkid)
{
    // using regular loop here since dual mapped vector shouldn't produce a modifiable lvalue
    for (size_t ii = 0; ii < mBrokers.size(); ++ii) {  // NOLINT
        auto& brk = mBrokers[ii];
        if (brk.global_id == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
            }
        }
        if (brk.parent == brkid) {
            if (brk.state != ConnectionState::ERROR_STATE) {
                brk.state = ConnectionState::DISCONNECTED;
                markAsDisconnected(brk.global_id);
            }
        }
    }
    for (size_t ii = 0; ii < mFederates.size(); ++ii) {  // NOLINT
        auto& fed = mFederates[ii];

        if (fed.parent == brkid) {
            if (fed.state != ConnectionState::ERROR_STATE) {
                fed.state = ConnectionState::DISCONNECTED;
                if (fed.reentrant) {
                    handles.removeFederateHandles(fed.global_id);
                }
            }
        }
    }
}